

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall FormatterTest_CenterAlign_Test::TestBody(FormatterTest_CenterAlign_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_string_view<char> format_str_12;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_12;
  AssertionResult gtest_ar;
  internal local_278 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  char *local_248;
  undefined2 local_240;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  undefined1 *local_230;
  long lStack_228;
  undefined8 local_220;
  undefined1 local_218 [504];
  
  local_248 = (char *)0x2a;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str.size_ = 6;
  format_str.data_ = "{0:^5}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str,args,(locale_ref)0x0);
  paVar1 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" 42  \"","format(\"{0:^5}\", 42)",(char (*) [6])" 42  ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x391,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0x22;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_00.size_ = 7;
  format_str_00.data_ = "{0:^5o}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_00,args_00,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" 42  \"","format(\"{0:^5o}\", 042)",(char (*) [6])" 42  ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x392,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0x42;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_01.size_ = 7;
  format_str_01.data_ = "{0:^5x}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_01,args_01,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" 42  \"","format(\"{0:^5x}\", 0x42)",(char (*) [6])" 42  ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x393,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = &DAT_ffffffd6;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_02.size_ = 6;
  format_str_02.data_ = "{0:^5}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_02,args_02,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" -42 \"","format(\"{0:^5}\", -42)",(char (*) [6])" -42 ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x394,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0x2a;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_03.size_ = 6;
  format_str_03.data_ = "{0:^5}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_03,args_03,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" 42  \"","format(\"{0:^5}\", 42u)",(char (*) [6])" 42  ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x395,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0xffffffffffffffd6;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_04.size_ = 6;
  format_str_04.data_ = "{0:^5}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_04,args_04,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" -42 \"","format(\"{0:^5}\", -42l)",(char (*) [6])" -42 ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x396,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0x2a;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_05.size_ = 6;
  format_str_05.data_ = "{0:^5}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_05,args_05,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" 42  \"","format(\"{0:^5}\", 42ul)",(char (*) [6])" 42  ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x397,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0xffffffffffffffd6;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_06.size_ = 6;
  format_str_06.data_ = "{0:^5}";
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_06,args_06,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" -42 \"","format(\"{0:^5}\", -42ll)",(char (*) [6])" -42 ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x398,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0x2a;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_07.size_ = 6;
  format_str_07.data_ = "{0:^5}";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_07,args_07,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" 42  \"","format(\"{0:^5}\", 42ull)",(char (*) [6])" 42  ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x399,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0xc045000000000000;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_08.size_ = 6;
  format_str_08.data_ = "{0:^6}";
  args_08.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_08.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_08,args_08,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_278,"\" -42  \"","format(\"{0:^6}\", -42.0)",(char (*) [7])" -42  ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0xa800000000000000;
  local_240 = 0xc004;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_09.size_ = 6;
  format_str_09.data_ = "{0:^5}";
  args_09.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_09.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_double>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_09,args_09,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\" -42 \"","format(\"{0:^5}\", -42.0l)",(char (*) [6])" -42 ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0x63;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_10.size_ = 6;
  format_str_10.data_ = "{0:^5}";
  args_10.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_10.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_10,args_10,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_278,"\"  c  \"","format(\"{0:^5}\", \'c\')",(char (*) [6])"  c  ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = "abc";
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_11.size_ = 6;
  format_str_11.data_ = "{0:^6}";
  args_11.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_11.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4]>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_11,args_11,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_278,"\" abc  \"","format(\"{0:^6}\", \"abc\")",(char (*) [7])" abc  ",&local_268)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248 = (char *)0xface;
  lStack_228 = 0;
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  local_220 = 500;
  format_str_12.size_ = 6;
  format_str_12.data_ = "{0:^8}";
  args_12.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_248;
  args_12.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
       ::TYPES;
  local_230 = local_218;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_238,format_str_12,args_12,(locale_ref)0x0);
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,local_230,local_230 + lStack_228);
  local_238.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a8bf0
  ;
  if (local_230 != local_218) {
    operator_delete(local_230);
  }
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            (local_278,"\" 0xface \"","format(\"{0:^8}\", reinterpret_cast<void*>(0xface))",
             (char (*) [9])" 0xface ",&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_278[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_270.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_270.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x39e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_268,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_268);
    if (local_238.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_238.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_238.ptr_ + 8))();
      }
      local_238.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FormatterTest, CenterAlign) {
  EXPECT_EQ(" 42  ", format("{0:^5}", 42));
  EXPECT_EQ(" 42  ", format("{0:^5o}", 042));
  EXPECT_EQ(" 42  ", format("{0:^5x}", 0x42));
  EXPECT_EQ(" -42 ", format("{0:^5}", -42));
  EXPECT_EQ(" 42  ", format("{0:^5}", 42u));
  EXPECT_EQ(" -42 ", format("{0:^5}", -42l));
  EXPECT_EQ(" 42  ", format("{0:^5}", 42ul));
  EXPECT_EQ(" -42 ", format("{0:^5}", -42ll));
  EXPECT_EQ(" 42  ", format("{0:^5}", 42ull));
  EXPECT_EQ(" -42  ", format("{0:^6}", -42.0));
  EXPECT_EQ(" -42 ", format("{0:^5}", -42.0l));
  EXPECT_EQ("  c  ", format("{0:^5}", 'c'));
  EXPECT_EQ(" abc  ", format("{0:^6}", "abc"));
  EXPECT_EQ(" 0xface ", format("{0:^8}", reinterpret_cast<void*>(0xface)));
}